

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O2

int __thiscall crypto::xchacha20::init(xchacha20 *this,EVP_PKEY_CTX *ctx)

{
  word wVar1;
  char *in_RDX;
  char subkey [32];
  char acStack_38 [32];
  
  derive_subkey((char *)ctx,in_RDX,acStack_38);
  init_state(this->state,acStack_38);
  this->state[0xc] = 0;
  this->state[0xd] = 0;
  this->state[0xe] = *(word *)(in_RDX + 0x10);
  wVar1 = *(word *)(in_RDX + 0x14);
  this->state[0xf] = wVar1;
  this->pos = '@';
  return wVar1;
}

Assistant:

void xchacha20::init(const char key[key_size], const char nonce[nonce_size]) {
	
	char subkey[key_size];
	derive_subkey(key, nonce, subkey);
	init_state(state, subkey);
	state[12] = 0;
	state[13] = 0;
	state[14] = util::little_endian::load<word>(nonce + 16);
	state[15] = util::little_endian::load<word>(nonce + 20);
	pos = sizeof(keystream);
	
}